

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O2

int __thiscall wabt::string_view::compare(string_view *this,string_view s)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  
  uVar2 = s.size_;
  __n = this->size_;
  if (uVar2 <= this->size_) {
    __n = uVar2;
  }
  uVar1 = std::char_traits<char>::compare(this->data_,s.data_,__n);
  if (uVar1 == 0) {
    uVar1 = 0;
    if (this->size_ != uVar2) {
      uVar1 = -(uint)(this->size_ < uVar2) | 1;
    }
  }
  return uVar1;
}

Assistant:

int string_view::compare(string_view s) const noexcept {
  size_type rlen = std::min(size_, s.size_);
  int result = traits_type::compare(data_, s.data_, rlen);
  if (result != 0 || size_ == s.size_) {
    return result;
  }
  return size_ < s.size_ ? -1 : 1;
}